

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSRGBDecodeCase::test
          (TextureSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  GLenum target;
  bool bVar1;
  deUint32 texture_00;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  bool local_859;
  GetNameFunc local_848;
  int local_840;
  string local_838;
  allocator<char> local_811;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  GLenum local_78c;
  GetNameFunc p_Stack_788;
  deUint32 err_8;
  int local_780;
  GetNameFunc local_778;
  int local_770;
  string local_768;
  allocator<char> local_741;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  GLenum local_6bc;
  GLuint local_6b8;
  deUint32 err_7;
  GLuint decode_1;
  GLuint skipDecode_1;
  int local_6a8;
  GetNameFunc local_6a0;
  int local_698;
  string local_690;
  allocator<char> local_669;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  GLenum local_5e4;
  GetNameFunc p_Stack_5e0;
  deUint32 err_6;
  int local_5d8;
  GetNameFunc local_5d0;
  int local_5c8;
  string local_5c0;
  allocator<char> local_599;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  GLenum local_514;
  GLint local_510;
  deUint32 err_5;
  GLint decode;
  GLint skipDecode;
  int local_500;
  GetNameFunc local_4f8;
  int local_4f0;
  string local_4e8;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  GLenum local_43c;
  GetNameFunc p_Stack_438;
  deUint32 err_4;
  int local_430;
  GetNameFunc local_428;
  int local_420;
  string local_418;
  allocator<char> local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  GLenum local_36c;
  GetNameFunc p_Stack_368;
  deUint32 err_3;
  int local_360;
  GetNameFunc local_358;
  int local_350;
  string local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  GLenum local_29c;
  GetNameFunc p_Stack_298;
  deUint32 err_2;
  int local_290;
  GetNameFunc local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  GLenum local_1d0;
  GLfloat local_1cc;
  deUint32 err_1;
  GLfloat decodeFloat;
  GLint decodeInt;
  allocator<char> local_199;
  string local_198;
  ScopedLogSection local_178;
  ScopedLogSection section_1;
  string local_168;
  allocator<char> local_141;
  string local_140;
  ScopedLogSection local_120;
  ScopedLogSection section;
  TestLog *local_108;
  int local_100;
  string local_f8;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  GLenum local_50;
  deUint32 err;
  undefined1 local_40 [8];
  Texture texture;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  TextureSRGBDecodeCase *this_local;
  
  bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
  local_859 = true;
  if (!bVar1) {
    local_859 = isPureUintTester((this->super_TextureTest).m_tester);
  }
  texture.super_ObjectWrapper._23_1_ = local_859;
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_40,
             (this->super_TextureTest).m_renderCtx);
  target = (this->super_TextureTest).m_target;
  texture_00 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_40);
  glu::CallLogWrapper::glBindTexture(gl,target,texture_00);
  do {
    local_50 = glu::CallLogWrapper::glGetError(gl);
    if (local_50 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Got Error ",&local_d1)
      ;
      EVar4 = glu::getErrorStr(local_50);
      section.m_log = (TestLog *)EVar4.m_getName;
      local_100 = EVar4.m_value;
      local_108 = section.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_f8,&local_108);
      std::operator+(&local_b0,&local_d0,&local_f8);
      std::operator+(&local_90,&local_b0,": ");
      std::operator+(&local_70,&local_90,"bind");
      tcu::ResultCollector::fail(result,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  if ((texture.super_ObjectWrapper._23_1_ & 1) == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"Initial",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_120,pTVar3,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_120);
  }
  if ((texture.super_ObjectWrapper._23_1_ & 1) == 0) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"Toggle",&local_199);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decodeInt,"Toggle",(allocator<char> *)((long)&decodeFloat + 3));
    tcu::ScopedLogSection::ScopedLogSection(&local_178,pTVar3,&local_198,(string *)&decodeInt);
    std::__cxx11::string::~string((string *)&decodeInt);
    std::allocator<char>::~allocator((allocator<char> *)((long)&decodeFloat + 3));
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    err_1 = 0x8a49;
    local_1cc = 35401.0;
    glu::CallLogWrapper::glTexParameteri
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a);
    do {
      local_1d0 = glu::CallLogWrapper::glGetError(gl);
      if (local_1d0 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"Got Error ",&local_251);
        EVar4 = glu::getErrorStr(local_1d0);
        p_Stack_298 = EVar4.m_getName;
        local_290 = EVar4.m_value;
        local_288 = p_Stack_298;
        local_280 = local_290;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
        std::operator+(&local_230,&local_250,&local_278);
        std::operator+(&local_210,&local_230,": ");
        std::operator+(&local_1f0,&local_210,"set state");
        tcu::ResultCollector::fail(result,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator(&local_251);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameteriv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&err_1);
    do {
      local_29c = glu::CallLogWrapper::glGetError(gl);
      if (local_29c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,"Got Error ",&local_321);
        EVar4 = glu::getErrorStr(local_29c);
        p_Stack_368 = EVar4.m_getName;
        local_360 = EVar4.m_value;
        local_358 = p_Stack_368;
        local_350 = local_360;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_348,&local_358);
        std::operator+(&local_300,&local_320,&local_348);
        std::operator+(&local_2e0,&local_300,": ");
        std::operator+(&local_2c0,&local_2e0,"set state");
        tcu::ResultCollector::fail(result,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator(&local_321);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterf
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,35402.0);
    do {
      local_36c = glu::CallLogWrapper::glGetError(gl);
      if (local_36c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"Got Error ",&local_3f1);
        EVar4 = glu::getErrorStr(local_36c);
        p_Stack_438 = EVar4.m_getName;
        local_430 = EVar4.m_value;
        local_428 = p_Stack_438;
        local_420 = local_430;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_418,&local_428);
        std::operator+(&local_3d0,&local_3f0,&local_418);
        std::operator+(&local_3b0,&local_3d0,": ");
        std::operator+(&local_390,&local_3b0,"set state");
        tcu::ResultCollector::fail(result,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterfv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_1cc);
    do {
      local_43c = glu::CallLogWrapper::glGetError(gl);
      if (local_43c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4c0,"Got Error ",&local_4c1);
        EVar4 = glu::getErrorStr(local_43c);
        _decode = EVar4.m_getName;
        local_500 = EVar4.m_value;
        local_4f8 = _decode;
        local_4f0 = local_500;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4e8,&local_4f8);
        std::operator+(&local_4a0,&local_4c0,&local_4e8);
        std::operator+(&local_480,&local_4a0,": ");
        std::operator+(&local_460,&local_480,"set state");
        tcu::ResultCollector::fail(result,&local_460);
        std::__cxx11::string::~string((string *)&local_460);
        std::__cxx11::string::~string((string *)&local_480);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4c0);
        std::allocator<char>::~allocator(&local_4c1);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_178);
  }
  bVar1 = isPureIntTester((this->super_TextureTest).m_tester);
  if (bVar1) {
    err_5 = 0x8a4a;
    local_510 = 0x8a49;
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               (GLint *)&err_5);
    do {
      local_514 = glu::CallLogWrapper::glGetError(gl);
      if (local_514 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,"Got Error ",&local_599);
        EVar4 = glu::getErrorStr(local_514);
        p_Stack_5e0 = EVar4.m_getName;
        local_5d8 = EVar4.m_value;
        local_5d0 = p_Stack_5e0;
        local_5c8 = local_5d8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_5c0,&local_5d0);
        std::operator+(&local_578,&local_598,&local_5c0);
        std::operator+(&local_558,&local_578,": ");
        std::operator+(&local_538,&local_558,"glTexParameterIiv");
        tcu::ResultCollector::fail(result,&local_538);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_510);
    do {
      local_5e4 = glu::CallLogWrapper::glGetError(gl);
      if (local_5e4 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"Got Error ",&local_669);
        EVar4 = glu::getErrorStr(local_5e4);
        _decode_1 = EVar4.m_getName;
        local_6a8 = EVar4.m_value;
        local_6a0 = _decode_1;
        local_698 = local_6a8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_690,&local_6a0);
        std::operator+(&local_648,&local_668,&local_690);
        std::operator+(&local_628,&local_648,": ");
        std::operator+(&local_608,&local_628,"glTexParameterIiv");
        tcu::ResultCollector::fail(result,&local_608);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
  }
  bVar1 = isPureUintTester((this->super_TextureTest).m_tester);
  if (bVar1) {
    err_7 = 0x8a4a;
    local_6b8 = 0x8a49;
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&err_7);
    do {
      local_6bc = glu::CallLogWrapper::glGetError(gl);
      if (local_6bc != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_740,"Got Error ",&local_741);
        EVar4 = glu::getErrorStr(local_6bc);
        p_Stack_788 = EVar4.m_getName;
        local_780 = EVar4.m_value;
        local_778 = p_Stack_788;
        local_770 = local_780;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_768,&local_778);
        std::operator+(&local_720,&local_740,&local_768);
        std::operator+(&local_700,&local_720,": ");
        std::operator+(&local_6e0,&local_700,"glTexParameterIuiv");
        tcu::ResultCollector::fail(result,&local_6e0);
        std::__cxx11::string::~string((string *)&local_6e0);
        std::__cxx11::string::~string((string *)&local_700);
        std::__cxx11::string::~string((string *)&local_720);
        std::__cxx11::string::~string((string *)&local_768);
        std::__cxx11::string::~string((string *)&local_740);
        std::allocator<char>::~allocator(&local_741);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a4a
               ,(this->super_TextureTest).m_type);
    glu::CallLogWrapper::glTexParameterIuiv
              (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_6b8);
    do {
      local_78c = glu::CallLogWrapper::glGetError(gl);
      if (local_78c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_810,"Got Error ",&local_811);
        EVar4 = glu::getErrorStr(local_78c);
        local_848 = EVar4.m_getName;
        local_840 = EVar4.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_838,&local_848);
        std::operator+(&local_7f0,&local_810,&local_838);
        std::operator+(&local_7d0,&local_7f0,": ");
        std::operator+(&local_7b0,&local_7d0,"glTexParameterIuiv");
        tcu::ResultCollector::fail(result,&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&local_838);
        std::__cxx11::string::~string((string *)&local_810);
        std::allocator<char>::~allocator(&local_811);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateTextureParamInteger
              (result,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0x8a49
               ,(this->super_TextureTest).m_type);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_40);
  return;
}

Assistant:

void TextureSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool		isPureCase	= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	glu::Texture	texture		(m_renderCtx);

	gl.glBindTexture(m_target, *texture);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind");

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (!isPureCase)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glTexParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glTexParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glTexParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glTexParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glTexParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}